

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

RTPTransmissionInfo * __thiscall
jrtplib::RTPUDPv4Transmitter::GetTransmissionInfo(RTPUDPv4Transmitter *this)

{
  RTPUDPv4TransmissionInfo *this_00;
  _List_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  if (this->init == true) {
    this_00 = (RTPUDPv4TransmissionInfo *)
              operator_new(0x38,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0x1c);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,&this->localIPs);
    RTPUDPv4TransmissionInfo::RTPUDPv4TransmissionInfo
              (this_00,(list<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,this->rtpsock,
               this->rtcpsock,this->m_rtpPort,this->m_rtcpPort);
    std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear(&local_30);
  }
  else {
    this_00 = (RTPUDPv4TransmissionInfo *)0x0;
  }
  return &this_00->super_RTPTransmissionInfo;
}

Assistant:

RTPTransmissionInfo *RTPUDPv4Transmitter::GetTransmissionInfo()
{
	if (!init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPUDPv4TransmissionInfo(localIPs,rtpsock,rtcpsock,m_rtpPort,m_rtcpPort);
	MAINMUTEX_UNLOCK
	return tinf;
}